

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkCountParams(Cba_Ntk_t *p,Vec_Int_t *vObjs,int *nPis,int *nPos,int *nFins,int *nFons)

{
  int iVar1;
  int iVar2;
  undefined4 local_3c;
  int iObj;
  int i;
  int *nFons_local;
  int *nFins_local;
  int *nPos_local;
  int *nPis_local;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  *nFons = 0;
  *nFins = 0;
  *nPos = 0;
  *nPis = 0;
  for (local_3c = 0; iVar1 = Vec_IntSize(vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    iVar1 = Vec_IntEntry(vObjs,local_3c);
    iVar2 = Cba_ObjIsPi(p,iVar1);
    *nPis = iVar2 + *nPis;
    iVar2 = Cba_ObjIsPo(p,iVar1);
    *nPos = iVar2 + *nPos;
    iVar2 = Cba_ObjFinNum(p,iVar1);
    *nFins = iVar2 + *nFins;
    iVar1 = Cba_ObjFonNum(p,iVar1);
    *nFons = iVar1 + *nFons;
  }
  return;
}

Assistant:

static inline void Cba_NtkCountParams( Cba_Ntk_t * p, Vec_Int_t * vObjs, int * nPis, int * nPos, int * nFins, int * nFons )
{
    int i, iObj;
    *nPis = *nPos = *nFins = *nFons = 0;
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        *nPis += Cba_ObjIsPi(p, iObj);
        *nPos += Cba_ObjIsPo(p, iObj);
        *nFins += Cba_ObjFinNum(p, iObj);
        *nFons += Cba_ObjFonNum(p, iObj);
    }
}